

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O1

bool __thiscall
EthBasePort::ReceiveBroadcastReadResponse(EthBasePort *this,quadlet_t *rdata,uint nbytes)

{
  byte bVar1;
  bool bVar2;
  undefined8 in_RAX;
  ostream *poVar3;
  nodeid_t src_node;
  ushort local_22;
  
  local_22 = (ushort)((ulong)in_RAX >> 0x30);
  if (this->useFwBridge == true) {
    bVar2 = BasePort::ReceiveBroadcastReadResponse(&this->super_BasePort,rdata,nbytes);
    return bVar2;
  }
  bVar2 = ReceiveResponseNode(this,0x3f,rdata,nbytes,this->fw_tl,&local_22);
  if (bVar2) {
    bVar1 = (this->super_BasePort).Node2Board[local_22];
    if (bVar1 < 0x10) {
      if (bVar1 != (this->super_BasePort).HubBoard) {
        (this->super_BasePort).HubBoard = bVar1;
      }
    }
    else {
      poVar3 = (this->super_BasePort).outStr;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,"ReceiveBroadcastReadResponse: invalid source node ",0x32);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
    }
  }
  else {
    poVar3 = (this->super_BasePort).outStr;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"ReceiveBroadcastReadResponse failed -- reading from board",0x39);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    bVar2 = BasePort::ReceiveBroadcastReadResponse(&this->super_BasePort,rdata,nbytes);
  }
  return bVar2;
}

Assistant:

bool EthBasePort::ReceiveBroadcastReadResponse(quadlet_t *rdata, unsigned int nbytes)
{
    bool ret;
    if (useFwBridge) {
        ret = BasePort::ReceiveBroadcastReadResponse(rdata, nbytes);
    }
    else {
        nodeid_t src_node;
        // Use FW_NODE_BROADCAST because we do not care which board responds
        ret = ReceiveResponseNode(FW_NODE_BROADCAST, rdata, nbytes, fw_tl, &src_node);
        if (ret) {
            unsigned char newHubBoard = Node2Board[src_node];
            if (newHubBoard >= BoardIO::MAX_BOARDS) {
                // Should not happen
                outStr << "ReceiveBroadcastReadResponse: invalid source node " << src_node << std::endl;
            }
            else if (newHubBoard != HubBoard) {
                // Not printing message because current hub board is shown in qladisp
                // outStr << "ReceiveBroadcastReadResponse: changing hub board from "
                //        << static_cast<unsigned int>(HubBoard) << " to "
                //        << static_cast<unsigned int>(newHubBoard) << std::endl;
                HubBoard = newHubBoard;
            }
        }
        else {
            outStr << "ReceiveBroadcastReadResponse failed -- reading from board" << std::endl;
            ret = BasePort::ReceiveBroadcastReadResponse(rdata, nbytes);
        }
    }
    return ret;
}